

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::Impl::emit_builtin_interpolation_decorations
          (Impl *this,Id variable_id,Semantic semantic,InterpolationMode mode)

{
  InterpolationMode local_16;
  InterpolationMode mode_local;
  Semantic semantic_local;
  Id variable_id_local;
  Impl *this_local;
  
  if (semantic != InternalBarycentricsNoPerspective) {
    if (semantic == Position) {
      if (mode == LinearNoperspective) {
        local_16 = Linear;
      }
      else if (mode == LinearNoperspectiveCentroid) {
        local_16 = LinearCentroid;
      }
      else {
        local_16 = mode;
        if (mode == LinearNoperspectiveSample) {
          local_16 = LinearSample;
        }
      }
      emit_interpolation_decorations(this,variable_id,local_16);
      return;
    }
    if (semantic != Barycentrics) {
      return;
    }
  }
  emit_interpolation_decorations(this,variable_id,mode);
  return;
}

Assistant:

void Converter::Impl::emit_builtin_interpolation_decorations(spv::Id variable_id,
                                                             DXIL::Semantic semantic,
                                                             DXIL::InterpolationMode mode)
{
	switch (semantic)
	{
	case DXIL::Semantic::Barycentrics:
	case DXIL::Semantic::InternalBarycentricsNoPerspective:
		emit_interpolation_decorations(variable_id, mode);
		break;

	case DXIL::Semantic::Position:
		// DXIL emits NoPerspective here, but seems weird to emit that since it's kinda implied.
		// Normalize the interpolate mode first, then emit.
		if (mode == DXIL::InterpolationMode::LinearNoperspective)
			mode = DXIL::InterpolationMode::Linear;
		else if (mode == DXIL::InterpolationMode::LinearNoperspectiveCentroid)
			mode = DXIL::InterpolationMode::LinearCentroid;
		else if (mode == DXIL::InterpolationMode::LinearNoperspectiveSample)
			mode = DXIL::InterpolationMode::LinearSample;
		emit_interpolation_decorations(variable_id, mode);
		break;

	default:
		break;
	}
}